

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cpp
# Opt level: O0

bool chatter::platform::HostAddressStringToNet32(string *address,uint32_t *out)

{
  bool bVar1;
  int iVar2;
  char *__cp;
  in_addr local_24;
  uint32_t *puStack_20;
  in_addr addr;
  uint32_t *out_local;
  string *address_local;
  
  if (out == (uint32_t *)0x0) {
    address_local._7_1_ = false;
  }
  else {
    puStack_20 = out;
    bVar1 = std::operator==(address,"");
    if (bVar1) {
      *puStack_20 = 0;
      address_local._7_1_ = true;
    }
    else {
      __cp = (char *)std::__cxx11::string::c_str();
      iVar2 = inet_aton(__cp,&local_24);
      if (iVar2 == 0) {
        address_local._7_1_ = false;
      }
      else {
        *puStack_20 = local_24.s_addr;
        address_local._7_1_ = true;
      }
    }
  }
  return address_local._7_1_;
}

Assistant:

bool HostAddressStringToNet32(const std::string address, uint32_t* out)
{
    if (!out)
        return false;

    if (address == "") {
        *out = INADDR_ANY;
        return true;
    }

    struct in_addr addr;
    if (inet_aton(address.c_str(), &addr) != 0) {
        *out = addr.s_addr;
        return true;
    }

    return false;
}